

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::GeneratedExtensionFinder::Find
          (GeneratedExtensionFinder *this,int number,ExtensionInfo *output)

{
  EnumValidityFuncWithArg *pEVar1;
  FieldDescriptor *pFVar2;
  FieldType FVar3;
  bool bVar4;
  bool bVar5;
  undefined5 uVar6;
  _Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::hash<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  *p_Var7;
  _Node *p_Var8;
  const_iterator cVar9;
  key_type local_20;
  
  p_Var7 = (anonymous_namespace)::registry_;
  if ((anonymous_namespace)::registry_ !=
      (_Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::hash<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
       *)0x0) {
    local_20.first = this->containing_type_;
    local_20.second = number;
    cVar9 = std::tr1::
            _Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::hash<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ::find((anonymous_namespace)::registry_,&local_20);
    p_Var8 = cVar9.
             super__Hashtable_iterator_base<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_false>
             ._M_cur_node;
    if (p_Var8 != p_Var7->_M_buckets[p_Var7->_M_bucket_count]) {
      FVar3 = (p_Var8->_M_v).second.type;
      bVar4 = (p_Var8->_M_v).second.is_repeated;
      bVar5 = (p_Var8->_M_v).second.is_packed;
      uVar6 = *(undefined5 *)&(p_Var8->_M_v).second.field_0x3;
      pEVar1 = (p_Var8->_M_v).second.field_3.enum_validity_check.func;
      pFVar2 = (p_Var8->_M_v).second.descriptor;
      (output->field_3).enum_validity_check.arg =
           (p_Var8->_M_v).second.field_3.enum_validity_check.arg;
      output->descriptor = pFVar2;
      output->type = FVar3;
      output->is_repeated = bVar4;
      output->is_packed = bVar5;
      *(undefined5 *)&output->field_0x3 = uVar6;
      (output->field_3).enum_validity_check.func = pEVar1;
      return true;
    }
  }
  return false;
}

Assistant:

const ExtensionInfo* FindRegisteredExtension(
    const MessageLite* containing_type, int number) {
  return (registry_ == NULL) ? NULL :
         FindOrNull(*registry_, make_pair(containing_type, number));
}